

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * libcellml::formDescriptionOfCyclicDependency
                   (string *__return_storage_ptr__,History *history,string *action)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  const_reference pvVar4;
  element_type *peVar5;
  char *__s;
  element_type *this_00;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string msgHistory;
  size_t i;
  HistoryEpochPtr h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string msgHeader;
  undefined1 local_78 [8];
  string typeStringPrefix;
  undefined1 local_40 [7];
  bool isComponent;
  ModelPtr model;
  value_type origin;
  string *action_local;
  History *history_local;
  
  pvVar4 = std::
           vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
           ::front(history);
  this = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<libcellml::HistoryEpoch>::shared_ptr
            ((shared_ptr<libcellml::HistoryEpoch> *)this,pvVar4);
  peVar5 = std::
           __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)local_40,&peVar5->mSourceModel);
  peVar5 = std::
           __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar3 = std::operator==(&peVar5->mType,"component");
  __s = "";
  if (bVar3) {
    __s = "a ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,__s,(allocator<char> *)(msgHeader.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(msgHeader.field_2._M_local_buf + 0xf));
  std::operator+(&local_160,"Cyclic dependencies were found when attempting to ",action);
  std::operator+(&local_140,&local_160," ");
  std::operator+(&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  peVar5 = std::
           __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::operator+(&local_100,&local_120,&peVar5->mType);
  std::operator+(&local_e0,&local_100," in the model \'");
  this_00 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_40);
  NamedEntity::name_abi_cxx11_
            ((string *)
             &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedEntity *)this_00);
  std::operator+(&local_c0,&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,"\'. The dependency loop is:\n");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string
            ((string *)
             &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::shared_ptr<libcellml::HistoryEpoch>::shared_ptr((shared_ptr<libcellml::HistoryEpoch> *)&i);
  msgHistory.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_1b8);
  for (; uVar1 = msgHistory.field_2._8_8_,
      sVar6 = std::
              vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
              ::size(history), (ulong)uVar1 < sVar6;
      msgHistory.field_2._8_8_ = msgHistory.field_2._8_8_ + 1) {
    pvVar4 = std::
             vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             ::operator[](history,msgHistory.field_2._8_8_);
    std::shared_ptr<libcellml::HistoryEpoch>::operator=
              ((shared_ptr<libcellml::HistoryEpoch> *)&i,pvVar4);
    peVar5 = std::
             __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::operator+(&local_2b8," - ",&peVar5->mType);
    std::operator+(&local_298,&local_2b8," \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::operator+(&local_278,&local_298,&peVar5->mName);
    std::operator+(&local_258,&local_278,"\' specifies an import from \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::operator+(&local_238,&local_258,&peVar5->mSourceUrl);
    std::operator+(&local_218,&local_238,"\' to \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::operator+(&local_1f8,&local_218,&peVar5->mDestinationUrl);
    std::operator+(&local_1d8,&local_1f8,"\'");
    std::__cxx11::string::operator+=((string *)local_1b8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    uVar1 = msgHistory.field_2._8_8_;
    sVar6 = std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::size(history);
    uVar2 = msgHistory.field_2._8_8_;
    if (uVar1 == sVar6 - 2) {
      std::__cxx11::string::operator+=((string *)local_1b8,"; and\n");
    }
    else {
      sVar6 = std::
              vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
              ::size(history);
      if (uVar2 == sVar6 - 1) {
        std::__cxx11::string::operator+=((string *)local_1b8,".");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_1b8,";\n");
      }
    }
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr((shared_ptr<libcellml::HistoryEpoch> *)&i);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
            ((shared_ptr<libcellml::HistoryEpoch> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string formDescriptionOfCyclicDependency(const History &history, const std::string &action)
{
    auto origin = history.front();
    auto model = origin->mSourceModel;
    bool isComponent = origin->mType == "component";
    std::string typeStringPrefix = isComponent ? "a " : "";
    std::string msgHeader = "Cyclic dependencies were found when attempting to " + action + " "
                            + typeStringPrefix + origin->mType + " in the model '"
                            + model->name() + "'. The dependency loop is:\n";
    HistoryEpochPtr h;
    size_t i = 0;
    std::string msgHistory;
    while (i < history.size()) {
        h = history[i];
        msgHistory += " - " + h->mType + " '" + h->mName + "' specifies an import from '" + h->mSourceUrl + "' to '" + h->mDestinationUrl + "'";
        if (i == history.size() - 2) {
            msgHistory += "; and\n";
        } else if (i == history.size() - 1) {
            msgHistory += ".";
        } else {
            msgHistory += ";\n";
        }
        ++i;
    }

    return msgHeader + msgHistory;
}